

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_sni_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (((hs->ssl->s3->field_0xdc & 0x20) == 0) && ((hs->field_0x6c9 & 1) != 0)) {
    bVar2 = false;
    iVar1 = CBB_add_u16(out,0);
    if (iVar1 != 0) {
      iVar1 = CBB_add_u16(out,0);
      bVar2 = iVar1 != 0;
    }
  }
  return bVar2;
}

Assistant:

static bool ext_sni_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (hs->ssl->s3->session_reused ||  //
      !hs->should_ack_sni) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_server_name) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}